

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O2

int aes_crypt_xts_wrap(void *ctx,mbedtls_operation_t operation,size_t length,uchar *data_unit,
                      uchar *input,uchar *output)

{
  int iVar1;
  long lVar2;
  mbedtls_aes_xts_context *xts_ctx;
  ulong uVar3;
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  byte abStack_78 [24];
  mbedtls_aes_context *pmStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  if (1 < (uint)operation) {
    return -0x6100;
  }
  if (0xffffffffff00000e < length - 0x1000001) {
    iVar1 = mbedtls_aes_crypt_ecb
                      ((mbedtls_aes_context *)((long)ctx + 0x120),1,data_unit,(uchar *)&uStack_58);
    if (iVar1 == 0) {
      uVar5 = (uint)length & 0xf;
      uVar6 = (ulong)uVar5;
      uVar3 = length >> 4;
      pmStack_60 = (mbedtls_aes_context *)ctx;
      while (bVar7 = uVar3 != 0, uVar3 = uVar3 - 1, bVar7) {
        if ((uVar6 != 0 && operation == MBEDTLS_DECRYPT) && uVar3 == 0) {
          uStack_48 = uStack_58;
          uStack_40 = uStack_50;
          mbedtls_gf128mul_x_ble((uchar *)&uStack_58,(uchar *)&uStack_58);
        }
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          abStack_78[lVar2] = *(byte *)((long)&uStack_58 + lVar2) ^ input[lVar2];
        }
        iVar1 = mbedtls_aes_crypt_ecb(pmStack_60,operation,abStack_78,abStack_78);
        if (iVar1 != 0) {
          return iVar1;
        }
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          output[lVar2] = *(byte *)((long)&uStack_58 + lVar2) ^ abStack_78[lVar2];
        }
        mbedtls_gf128mul_x_ble((uchar *)&uStack_58,(uchar *)&uStack_58);
        output = output + 0x10;
        input = input + 0x10;
      }
      if (uVar6 == 0) {
        iVar1 = 0;
      }
      else {
        puVar4 = (uchar *)&uStack_58;
        if (operation == MBEDTLS_DECRYPT) {
          puVar4 = (uchar *)&uStack_48;
        }
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          output[uVar3] = output[uVar3 - 0x10];
          abStack_78[uVar3] = puVar4[uVar3] ^ input[uVar3];
        }
        lVar2 = (0x10 - (ulong)(uVar5 * 2)) + uVar3;
        while (bVar7 = lVar2 != 0, lVar2 = lVar2 + -1, bVar7) {
          abStack_78[uVar6] = puVar4[uVar6] ^ output[uVar6 - 0x10];
          uVar6 = uVar6 + 1;
        }
        iVar1 = mbedtls_aes_crypt_ecb(pmStack_60,operation,abStack_78,abStack_78);
        if (iVar1 == 0) {
          iVar1 = 0;
          for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
            output[lVar2 + -0x10] = puVar4[lVar2] ^ abStack_78[lVar2];
          }
        }
      }
    }
    return iVar1;
  }
  return -0x22;
}

Assistant:

static int aes_crypt_xts_wrap( void *ctx, mbedtls_operation_t operation,
                               size_t length,
                               const unsigned char data_unit[16],
                               const unsigned char *input,
                               unsigned char *output )
{
    mbedtls_aes_xts_context *xts_ctx = ctx;
    int mode;

    switch( operation )
    {
        case MBEDTLS_ENCRYPT:
            mode = MBEDTLS_AES_ENCRYPT;
            break;
        case MBEDTLS_DECRYPT:
            mode = MBEDTLS_AES_DECRYPT;
            break;
        default:
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    return mbedtls_aes_crypt_xts( xts_ctx, mode, length,
                                  data_unit, input, output );
}